

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

int pbrt::GenerateLightSubpath
              (Integrator *integrator,SampledWavelengths *lambda,SamplerHandle *sampler,
              CameraHandle *camera,ScratchBuffer *scratchBuffer,int maxDepth,Float time,
              LightSamplerHandle lightSampler,Vertex *path,bool regularize)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  SampledLight *pSVar6;
  Interaction *intr;
  int iVar7;
  Float FVar8;
  type tVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar12 [64];
  undefined1 auVar14 [64];
  SampledSpectrum SVar16;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_348;
  ScratchBuffer *local_340;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_338;
  optional<pbrt::SampledLight> sampledLight;
  Ray local_318;
  uint local_2f0;
  float fStack_2ec;
  undefined8 uStack_2e8;
  float fStack_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  undefined8 uStack_2cc;
  undefined8 uStack_2c4;
  LightSamplerHandle local_2b0;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_2a8;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_2a0;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_298;
  LightLeSample les;
  undefined1 local_1f8 [22] [16];
  RayDifferential local_98;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar13 [56];
  undefined1 auVar15 [56];
  
  if (maxDepth == 0) {
    iVar5 = 0;
  }
  else {
    local_340 = scratchBuffer;
    FVar8 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
            ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                      ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                        *)sampler);
    LightSamplerHandle::Sample
              (&sampledLight,
               (LightSamplerHandle *)
               lightSampler.
               super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
               .bits,FVar8);
    iVar5 = 0;
    if (sampledLight.set == true) {
      pSVar6 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
      local_348.bits =
           (pSVar6->light).
           super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
           .bits;
      pSVar6 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
      fVar1 = pSVar6->pdf;
      auVar10._0_8_ =
           TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
           ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       *)sampler);
      auVar10._8_56_ = extraout_var;
      local_1f8[0]._0_8_ = vmovlps_avx(auVar10._0_16_);
      auVar11._0_8_ =
           TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
           ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       *)sampler);
      auVar11._8_56_ = extraout_var_00;
      local_318.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar11._0_16_);
      LightHandle::SampleLe
                (&les,(LightHandle *)&local_348,(Point2f *)local_1f8,(Point2f *)&local_318,lambda,
                 time);
      iVar7 = 0;
      if ((les.pdfPos != 0.0) || (iVar5 = 0, NAN(les.pdfPos))) {
        uVar2 = vcmpps_avx512vl(ZEXT816(0) << 0x40,ZEXT416((uint)les.pdfPos),5);
        uVar3 = vcmpps_avx512vl(ZEXT816(0) << 0x40,ZEXT416((uint)les.pdfDir),5);
        iVar5 = iVar7;
        if (((uVar2 & uVar3 & 1) == 0) && ((les.pdfDir != 0.0 || (NAN(les.pdfDir))))) {
          bVar4 = SampledSpectrum::operator_cast_to_bool(&les.L);
          if (bVar4) {
            local_318.d.super_Tuple3<pbrt::Vector3,_float>.z =
                 les.ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
            local_318.time = les.ray.time;
            local_318.o.super_Tuple3<pbrt::Point3,_float>.x =
                 les.ray.o.super_Tuple3<pbrt::Point3,_float>.x;
            local_318.o.super_Tuple3<pbrt::Point3,_float>.y =
                 les.ray.o.super_Tuple3<pbrt::Point3,_float>.y;
            local_318.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = les.ray.medium.
                    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                    .bits;
            local_2f0 = local_2f0 & 0xffffff00;
            fStack_2ec = 0.0;
            uStack_2e8._0_4_ = 0.0;
            uStack_2e8._4_4_ = 0.0;
            fStack_2e0 = 0.0;
            fStack_2d8 = 0.0;
            fStack_2d4 = 0.0;
            uStack_2cc._0_4_ = 0.0;
            uStack_2cc._4_4_ = 0.0;
            uStack_2c4._0_4_ = 0.0;
            uStack_2c4._4_4_ = 0.0;
            fStack_2dc = fStack_2ec;
            fStack_2d0 = fStack_2e0;
            if (les.intr.set == true) {
              local_338.bits = local_348.bits;
              auVar15 = ZEXT856((ulong)les.ray._20_8_);
              intr = pstd::optional<pbrt::Interaction>::value(&les.intr);
              Vertex::CreateLight((Vertex *)local_1f8,(LightHandle *)&local_338,&local_318,intr,
                                  &les.L,fVar1 * les.pdfPos);
            }
            else {
              local_298.bits = local_348.bits;
              auVar15 = ZEXT856((ulong)les.ray._20_8_);
              Vertex::CreateLight((Vertex *)local_1f8,(LightHandle *)&local_298,&local_318,&les.L,
                                  fVar1 * les.pdfPos);
            }
            memcpy(path,local_1f8,0x160);
            FVar8 = LightLeSample::AbsCosTheta(&les,&local_318.d);
            auVar13 = extraout_var_01;
            SVar16 = SampledSpectrum::operator*(&les.L,FVar8);
            auVar14._0_8_ = SVar16.values.values._8_8_;
            auVar14._8_56_ = auVar15;
            auVar12._0_8_ = SVar16.values.values._0_8_;
            auVar12._8_56_ = auVar13;
            local_1f8[0] = vmovlhps_avx(auVar12._0_16_,auVar14._0_16_);
            SVar16 = SampledSpectrum::operator/
                               ((SampledSpectrum *)local_1f8,fVar1 * les.pdfPos * les.pdfDir);
            local_98.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z =
                 local_318.d.super_Tuple3<pbrt::Vector3,_float>.z;
            local_98.super_Ray.time = local_318.time;
            local_98.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x =
                 local_318.o.super_Tuple3<pbrt::Point3,_float>.x;
            local_98.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y =
                 local_318.o.super_Tuple3<pbrt::Point3,_float>.y;
            local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x = fStack_2ec;
            local_98._40_4_ = local_2f0;
            local_98.super_Ray.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = local_318.medium.
                    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                    .bits;
            local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y = (float)uStack_2e8;
            local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z = uStack_2e8._4_4_;
            local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = fStack_2e0;
            local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y = fStack_2dc;
            local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z = fStack_2d8;
            local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = fStack_2d4;
            local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y = fStack_2d0;
            local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = (float)uStack_2cc;
            local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.x = uStack_2cc._4_4_;
            local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_2c4;
            local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z = uStack_2c4._4_4_;
            local_2a0.bits =
                 (sampler->
                 super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
            local_2a8.bits =
                 (camera->
                 super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                 ).bits;
            iVar5 = RandomWalk(integrator,lambda,&local_98,(SamplerHandle *)&local_2a0,
                               (CameraHandle *)&local_2a8,local_340,SVar16,les.pdfDir,maxDepth + -1,
                               Importance,path + 1,regularize);
            bVar4 = Vertex::IsInfiniteLight(path);
            if (bVar4) {
              if (0 < iVar5) {
                path[1].pdfFwd = les.pdfPos;
                bVar4 = Vertex::IsOnSurface(path + 1);
                if (bVar4) {
                  tVar9 = AbsDot<float>(&local_318.d,&path[1].field_2.ei.super_Interaction.n);
                  path[1].pdfFwd = tVar9 * path[1].pdfFwd;
                }
              }
              local_2b0.
              super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
              .bits = *(TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                        *)lightSampler.
                          super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                          .bits;
              FVar8 = InfiniteLightDensity(&integrator->infiniteLights,&local_2b0,&local_318.d);
              path->pdfFwd = FVar8;
            }
            iVar5 = iVar5 + 1;
          }
        }
      }
      pstd::optional<pbrt::Interaction>::~optional(&les.intr);
    }
    pstd::optional<pbrt::SampledLight>::~optional(&sampledLight);
  }
  return iVar5;
}

Assistant:

int GenerateLightSubpath(const Integrator &integrator, SampledWavelengths &lambda,
                         SamplerHandle sampler, CameraHandle camera,
                         ScratchBuffer &scratchBuffer, int maxDepth, Float time,
                         LightSamplerHandle lightSampler, Vertex *path, bool regularize) {
    if (maxDepth == 0)
        return 0;
    // Sample initial ray for light subpath
    pstd::optional<SampledLight> sampledLight = lightSampler.Sample(sampler.Get1D());
    if (!sampledLight)
        return 0;
    LightHandle light = sampledLight->light;
    Float lightPDF = sampledLight->pdf;
    LightLeSample les = light.SampleLe(sampler.Get2D(), sampler.Get2D(), lambda, time);
    if (!les || les.pdfPos == 0 || les.pdfDir == 0 || !les.L)
        return 0;
    RayDifferential ray(les.ray);

    // Generate first vertex on light subpath and start random walk
    path[0] = les.intr ? Vertex::CreateLight(light, ray, *les.intr, les.L,
                                             les.pdfPos * lightPDF)
                       : Vertex::CreateLight(light, ray, les.L, les.pdfPos * lightPDF);
    SampledSpectrum beta =
        les.L * les.AbsCosTheta(ray.d) / (lightPDF * les.pdfPos * les.pdfDir);
    PBRT_DBG("%s\n",
             StringPrintf(
                 "Starting light subpath. Ray: %s, Le %s, beta %s, pdfPos %f, pdfDir %f",
                 ray, les.L, beta, les.pdfPos, les.pdfDir)
                 .c_str());
    int nVertices = RandomWalk(integrator, lambda, ray, sampler, camera, scratchBuffer,
                               beta, les.pdfDir, maxDepth - 1, TransportMode::Importance,
                               path + 1, regularize);
    // Correct subpath sampling densities for infinite area lights
    if (path[0].IsInfiniteLight()) {
        // Set spatial density of _path[1]_ for infinite area light
        if (nVertices > 0) {
            path[1].pdfFwd = les.pdfPos;
            if (path[1].IsOnSurface())
                path[1].pdfFwd *= AbsDot(ray.d, path[1].ng());
        }

        // Set spatial density of _path[0]_ for infinite area light
        path[0].pdfFwd =
            InfiniteLightDensity(integrator.infiniteLights, lightSampler, ray.d);
    }

    return nVertices + 1;
}